

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalSetFileTime
                    (CPalThread *pThread,HANDLE hFile,FILETIME *lpCreationTime,
                    FILETIME *lpLastAccessTime,FILETIME *lpLastWriteTime)

{
  int iVar1;
  undefined1 local_118 [8];
  stat stat_buf;
  long nsec;
  undefined1 auStack_78 [4];
  int fd;
  timeval Times [2];
  undefined8 *local_50;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  FILETIME *pFStack_30;
  PAL_ERROR palError;
  FILETIME *lpLastWriteTime_local;
  FILETIME *lpLastAccessTime_local;
  FILETIME *lpCreationTime_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_50 = (undefined8 *)0x0;
  pFStack_30 = lpLastWriteTime;
  lpLastWriteTime_local = lpLastAccessTime;
  lpLastAccessTime_local = lpCreationTime;
  lpCreationTime_local = (FILETIME *)hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,&local_50,&pLocalDataLock), pFileObject._4_4_ == 0)
       ) {
      if (lpLastAccessTime_local == (FILETIME *)0x0) {
        if ((lpLastWriteTime_local != (FILETIME *)0x0) || (pFStack_30 != (FILETIME *)0x0)) {
          if ((lpLastWriteTime_local == (FILETIME *)0x0) || (pFStack_30 == (FILETIME *)0x0)) {
            if (*(int *)&pLocalDataLock[1]._vptr_IDataLock == -1) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pFileObject._4_4_ = 6;
              goto LAB_0039b758;
            }
            iVar1 = fstat64(*(int *)&pLocalDataLock[1]._vptr_IDataLock,(stat64 *)local_118);
            if (iVar1 != 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pFileObject._4_4_ = FILEGetLastErrorFromErrno();
              goto LAB_0039b758;
            }
          }
          if (lpLastWriteTime_local == (FILETIME *)0x0) {
            _auStack_78 = stat_buf.st_blocks;
            Times[0].tv_sec = 0;
          }
          else {
            _auStack_78 = FILEFileTimeToUnixTime
                                    (*lpLastWriteTime_local,stat_buf.__glibc_reserved + 2);
            Times[0].tv_sec = stat_buf.__glibc_reserved[2] / 1000;
          }
          if (pFStack_30 == (FILETIME *)0x0) {
            Times[0].tv_usec = stat_buf.st_atim.tv_nsec;
            Times[1].tv_sec = 0;
          }
          else {
            Times[0].tv_usec = FILEFileTimeToUnixTime(*pFStack_30,stat_buf.__glibc_reserved + 2);
            Times[1].tv_sec = stat_buf.__glibc_reserved[2] / 1000;
          }
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          iVar1 = futimes(*(int *)&pLocalDataLock[1]._vptr_IDataLock,(timeval *)auStack_78);
          if (iVar1 != 0) {
            pFileObject._4_4_ = FILEGetLastErrorFromErrno();
          }
        }
      }
      else {
        pFileObject._4_4_ = 0x32;
      }
    }
  }
LAB_0039b758:
  if (local_50 != (undefined8 *)0x0) {
    (**(code **)*local_50)(local_50,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetFileTime(
        CPalThread *pThread,
        IN HANDLE hFile,
        IN CONST FILETIME *lpCreationTime,
        IN CONST FILETIME *lpLastAccessTime,
        IN CONST FILETIME *lpLastWriteTime)
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    struct timeval Times[2];
    int fd;
    long nsec;
    struct stat stat_buf;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalSetFileTimeExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFileTimeExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFileTimeExit;
    }
    
    if (lpCreationTime)
    {
        palError = ERROR_NOT_SUPPORTED;
        goto InternalSetFileTimeExit;
    }

    if( !lpLastAccessTime && !lpLastWriteTime )
    { 
	// if both pointers are NULL, the function simply returns.
        goto InternalSetFileTimeExit;
    }
    else if( !lpLastAccessTime || !lpLastWriteTime )
    {
	// if either pointer is NULL, fstat will need to be called.
	fd = pLocalData->unix_fd;
	if ( fd == -1 )
        {
          TRACE("pLocalData = [%p], fd = %d\n", pLocalData, fd);
          palError = ERROR_INVALID_HANDLE;
          goto InternalSetFileTimeExit;
        } 

	if ( fstat(fd, &stat_buf) != 0 )
    	{
          TRACE("fstat failed on file descriptor %d\n", fd);
          palError = FILEGetLastErrorFromErrno();
          goto InternalSetFileTimeExit;
        }
    }

    if (lpLastAccessTime)
    {
        Times[0].tv_sec = FILEFileTimeToUnixTime( *lpLastAccessTime, &nsec );
        Times[0].tv_usec = nsec / 1000; /* convert to microseconds */
    }
    else
    {
	    Times[0].tv_sec = stat_buf.st_atime;
	    Times[0].tv_usec = ST_ATIME_NSEC(&stat_buf) / 1000;
    }

    if (lpLastWriteTime)
    {
        Times[1].tv_sec = FILEFileTimeToUnixTime( *lpLastWriteTime, &nsec );
        Times[1].tv_usec = nsec / 1000; /* convert to microseconds */
    }
    else
    {
        Times[1].tv_sec = stat_buf.st_mtime;
        Times[1].tv_usec = ST_MTIME_NSEC(&stat_buf) / 1000;
    }

    TRACE("Setting atime = [%ld.%ld], mtime = [%ld.%ld]\n",
          Times[0].tv_sec, Times[0].tv_usec,
          Times[1].tv_sec, Times[1].tv_usec);

#if HAVE_FUTIMES
    if ( futimes(pLocalData->unix_fd, Times) != 0 )
#elif HAVE_UTIMES
    if ( utimes(pLocalData->unix_filename, Times) != 0 )
#else
  #error Operating system not supported
#endif
    {
        palError = FILEGetLastErrorFromErrno();
    }

InternalSetFileTimeExit:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}